

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

void __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::buildProgram(CaptureVertexInterleaved *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  GLuint GVar4;
  undefined4 extraout_var;
  undefined4 *puVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  GLint i;
  GLint i_00;
  GLint i_01;
  GLint i_02;
  GLint i_03;
  uint uVar9;
  char *this_00;
  ulong uVar10;
  string local_248;
  string varying;
  string transform_feedback_variable_declarations;
  string vertex_shader;
  string transform_feedback_variable_setters;
  vector<const_char_*,_std::allocator<const_char_*>_> transform_feedback_varyings_c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  transform_feedback_varyings;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar3 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertex_shader,s_vertex_shader_source_code_template,
             (allocator<char> *)&transform_feedback_variable_declarations);
  transform_feedback_variable_declarations._M_dataplus._M_p =
       (pointer)&transform_feedback_variable_declarations.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&transform_feedback_variable_declarations,0x1aee929);
  transform_feedback_variable_setters._M_dataplus._M_p =
       (pointer)&transform_feedback_variable_setters.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&transform_feedback_variable_setters,0x1aee929);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&transform_feedback_varyings,(long)this->m_max_transform_feedback_components,
           (allocator_type *)&varying);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (&transform_feedback_varyings_c,(long)this->m_max_transform_feedback_components,
             (allocator_type *)&varying);
  iVar2 = this->m_max_transform_feedback_components;
  iVar6 = iVar2 + 3;
  if (-1 < iVar2) {
    iVar6 = iVar2;
  }
  uVar7 = (iVar6 >> 2) - 1;
  if (7 < iVar2) {
    paVar1 = &local_248.field_2;
    uVar8 = 1;
    if (1 < (int)uVar7) {
      uVar8 = (ulong)uVar7;
    }
    uVar10 = 0;
    do {
      varying._M_dataplus._M_p = (pointer)&varying.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&varying,"result_","");
      Utilities::itoa_abi_cxx11_(&local_248,(Utilities *)(uVar10 & 0xffffffff),i);
      std::__cxx11::string::_M_append((char *)&varying,(ulong)local_248._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar1) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 (transform_feedback_varyings.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar10));
      transform_feedback_varyings_c.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar10] =
           transform_feedback_varyings.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p;
      std::__cxx11::string::append((char *)&transform_feedback_variable_declarations);
      std::__cxx11::string::_M_append
                ((char *)&transform_feedback_variable_declarations,(ulong)varying._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&transform_feedback_variable_declarations);
      std::__cxx11::string::append((char *)&transform_feedback_variable_setters);
      std::__cxx11::string::_M_append
                ((char *)&transform_feedback_variable_setters,(ulong)varying._M_dataplus._M_p);
      std::__cxx11::string::append((char *)&transform_feedback_variable_setters);
      uVar9 = (uint)(uVar10 * 4);
      Utilities::itoa_abi_cxx11_(&local_248,(Utilities *)(uVar10 * 4 & 0xffffffff),i_00);
      std::__cxx11::string::_M_append
                ((char *)&transform_feedback_variable_setters,(ulong)local_248._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar1) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&transform_feedback_variable_setters);
      Utilities::itoa_abi_cxx11_(&local_248,(Utilities *)(ulong)(uVar9 | 1),i_01);
      std::__cxx11::string::_M_append
                ((char *)&transform_feedback_variable_setters,(ulong)local_248._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar1) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&transform_feedback_variable_setters);
      Utilities::itoa_abi_cxx11_(&local_248,(Utilities *)(ulong)(uVar9 | 2),i_02);
      std::__cxx11::string::_M_append
                ((char *)&transform_feedback_variable_setters,(ulong)local_248._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar1) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&transform_feedback_variable_setters);
      Utilities::itoa_abi_cxx11_(&local_248,(Utilities *)(ulong)(uVar9 | 3),i_03);
      std::__cxx11::string::_M_append
                ((char *)&transform_feedback_variable_setters,(ulong)local_248._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != paVar1) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&transform_feedback_variable_setters);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)varying._M_dataplus._M_p != &varying.field_2) {
        operator_delete(varying._M_dataplus._M_p,varying.field_2._M_allocated_capacity + 1);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar8);
  }
  std::__cxx11::string::_M_replace
            ((ulong)(transform_feedback_varyings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (int)uVar7),0,
             (char *)transform_feedback_varyings.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)uVar7]._M_string_length,
             0x19eeb36);
  transform_feedback_varyings_c.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
  _M_impl.super__Vector_impl_data._M_start[(int)uVar7] =
       transform_feedback_varyings.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[(int)uVar7]._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,vertex_shader._M_dataplus._M_p,
             vertex_shader._M_dataplus._M_p + vertex_shader._M_string_length);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"TEMPLATE_INPUT_OUTPUT_DECLARATIONS","");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,transform_feedback_variable_declarations._M_dataplus._M_p,
             transform_feedback_variable_declarations._M_dataplus._M_p +
             transform_feedback_variable_declarations._M_string_length);
  Utilities::preprocessCode(&varying,&local_70,&local_90,&local_b0);
  std::__cxx11::string::operator=((string *)&vertex_shader,(string *)&varying);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)varying._M_dataplus._M_p != &varying.field_2) {
    operator_delete(varying._M_dataplus._M_p,varying.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,vertex_shader._M_dataplus._M_p,
             vertex_shader._M_dataplus._M_p + vertex_shader._M_string_length);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"TEMPLATE_OUTPUT_SETTERS","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,transform_feedback_variable_setters._M_dataplus._M_p,
             transform_feedback_variable_setters._M_dataplus._M_p +
             transform_feedback_variable_setters._M_string_length);
  Utilities::preprocessCode(&varying,&local_d0,&local_f0,&local_110);
  std::__cxx11::string::operator=((string *)&vertex_shader,(string *)&varying);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)varying._M_dataplus._M_p != &varying.field_2) {
    operator_delete(varying._M_dataplus._M_p,varying.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,vertex_shader._M_dataplus._M_p,
             vertex_shader._M_dataplus._M_p + vertex_shader._M_string_length);
  this_00 = "TEMPLATE_RASTERIZATION_EPSILON";
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"TEMPLATE_RASTERIZATION_EPSILON","");
  Utilities::ftoa_abi_cxx11_(&local_50,(Utilities *)this_00,0.0625);
  Utilities::preprocessCode(&varying,&local_130,&local_150,&local_50);
  std::__cxx11::string::operator=((string *)&vertex_shader,(string *)&varying);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)varying._M_dataplus._M_p != &varying.field_2) {
    operator_delete(varying._M_dataplus._M_p,varying.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  GVar4 = Utilities::buildProgram
                    ((Functions *)CONCAT44(extraout_var,iVar3),this->m_context->m_testCtx->m_log,
                     (GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,vertex_shader._M_dataplus._M_p,
                     s_fragment_shader_source_code,
                     transform_feedback_varyings_c.
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_start,iVar6 >> 2,this->m_attrib_type,false,
                     (GLint *)0x0);
  this->m_program = GVar4;
  if (GVar4 != 0) {
    if (transform_feedback_varyings_c.
        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(transform_feedback_varyings_c.
                      super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)transform_feedback_varyings_c.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)transform_feedback_varyings_c.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&transform_feedback_varyings);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)transform_feedback_variable_setters._M_dataplus._M_p !=
        &transform_feedback_variable_setters.field_2) {
      operator_delete(transform_feedback_variable_setters._M_dataplus._M_p,
                      transform_feedback_variable_setters.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)transform_feedback_variable_declarations._M_dataplus._M_p !=
        &transform_feedback_variable_declarations.field_2) {
      operator_delete(transform_feedback_variable_declarations._M_dataplus._M_p,
                      transform_feedback_variable_declarations.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)vertex_shader._M_dataplus._M_p != &vertex_shader.field_2) {
      operator_delete(vertex_shader._M_dataplus._M_p,vertex_shader.field_2._M_allocated_capacity + 1
                     );
    }
    return;
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 0;
  __cxa_throw(puVar5,&int::typeinfo,0);
}

Assistant:

void gl3cts::TransformFeedback::CaptureVertexInterleaved::buildProgram(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Preparing source code. */
	std::string vertex_shader(s_vertex_shader_source_code_template); /* Storage for vertex shader source code. */
	std::string transform_feedback_variable_declarations(
		""); /* String to contain all custom outputs from vertex shader. */
	std::string transform_feedback_variable_setters(
		""); /* String containing all initializations of custom outputs from vertex shader. */
	std::vector<std::string> transform_feedback_varyings(m_max_transform_feedback_components); /* Varyings array. */
	std::vector<const glw::GLchar*> transform_feedback_varyings_c(
		m_max_transform_feedback_components); /* Varyings array in C form to pass to the GL. */

	glw::GLint user_defined_transform_feedback_interleaved_varyings_count =
		m_max_transform_feedback_components /* total max to be written by the shader */
			/ 4								/* components per vec4 */
		- 1 /* gl_Position */;

	glw::GLint all_transform_feedback_interleaved_varyings_count =
		user_defined_transform_feedback_interleaved_varyings_count + 1 /* gl_Position */;

	/* Most of varyings is declarated output variables. */
	for (glw::GLint i = 0; i < user_defined_transform_feedback_interleaved_varyings_count; ++i)
	{
		std::string varying = "result_";
		varying.append(gl3cts::TransformFeedback::Utilities::itoa(i));

		transform_feedback_varyings[i] = varying;

		transform_feedback_varyings_c[i] = transform_feedback_varyings[i].c_str();

		transform_feedback_variable_declarations.append("out vec4 ");
		transform_feedback_variable_declarations.append(varying);
		transform_feedback_variable_declarations.append(";\n");

		transform_feedback_variable_setters.append("    ");
		transform_feedback_variable_setters.append(varying);
		transform_feedback_variable_setters.append(" = vec4(");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4));
		transform_feedback_variable_setters.append(".0, ");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4 + 1));
		transform_feedback_variable_setters.append(".0, ");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4 + 2));
		transform_feedback_variable_setters.append(".0, ");
		transform_feedback_variable_setters.append(gl3cts::TransformFeedback::Utilities::itoa(i * 4 + 3));
		transform_feedback_variable_setters.append(".0);\n");
	}

	/* Last four varying components are gl_Position components. */
	transform_feedback_varyings[user_defined_transform_feedback_interleaved_varyings_count] = "gl_Position";

	transform_feedback_varyings_c[user_defined_transform_feedback_interleaved_varyings_count] =
		transform_feedback_varyings[user_defined_transform_feedback_interleaved_varyings_count].c_str();

	/* Preprocess vertex shader source code template. */
	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(
		vertex_shader, "TEMPLATE_INPUT_OUTPUT_DECLARATIONS", transform_feedback_variable_declarations);
	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(vertex_shader, "TEMPLATE_OUTPUT_SETTERS",
																		 transform_feedback_variable_setters);
	vertex_shader = gl3cts::TransformFeedback::Utilities::preprocessCode(
		vertex_shader, "TEMPLATE_RASTERIZATION_EPSILON",
		gl3cts::TransformFeedback::Utilities::ftoa(s_rasterization_epsilon));

	/* Compile, link and check. */
	m_program = gl3cts::TransformFeedback::Utilities::buildProgram(
		gl, m_context.getTestContext().getLog(), NULL, NULL, NULL, vertex_shader.c_str(), s_fragment_shader_source_code,
		&transform_feedback_varyings_c[0], all_transform_feedback_interleaved_varyings_count, m_attrib_type);

	if (0 == m_program)
	{
		throw 0;
	}
}